

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exclusion.cpp
# Opt level: O3

string * __thiscall Exclusion::dump_abi_cxx11_(string *__return_storage_ptr__,Exclusion *this)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40," ","");
  join(__return_storage_ptr__,&local_40,&this->_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Exclusion::dump () const
{
  return join (" ", _tokens);
}